

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
               (uint64_t *out1,uint64_t *out2,uint64_t arg1,uint64_t arg2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t x3;
  uint64_t x2;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint128 x1;
  uint64_t arg2_local;
  uint64_t arg1_local;
  uint64_t *out2_local;
  uint64_t *out1_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = arg1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = arg2;
  x1._0_8_ = SUB168(auVar1 * auVar2,0);
  x1._8_8_ = SUB168(auVar1 * auVar2,8);
  *out1 = (uint64_t)x1;
  *out2 = x1._8_8_;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
    uint64_t *out1, uint64_t *out2, uint64_t arg1, uint64_t arg2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint128 x1;
    uint64_t x2;
    uint64_t x3;
    x1 = ((fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint128)arg1 * arg2);
    x2 = (uint64_t)(x1 & UINT64_C(0xffffffffffffffff));
    x3 = (uint64_t)(x1 >> 64);
    *out1 = x2;
    *out2 = x3;
}